

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.test.cpp
# Opt level: O1

string * chunkSectionMF3v2_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 1.001000+3 9.991673-1          0          0          0          0 125 3102     \n 1.123400+6 1.123400+6          0          0          1          4 125 3102     \n          2          2                                             125 3102     \n 1.000000-5 2.000000+0 2.000000+7 1.000000+0                       125 3102     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkSectionMF3v2() {

  // this is a dummy MF3 section, it is ENDF legal
  return
    " 1.001000+3 9.991673-1          0          0          0          0 125 3102     \n"
    " 1.123400+6 1.123400+6          0          0          1          4 125 3102     \n"
    "          2          2                                             125 3102     \n"
    " 1.000000-5 2.000000+0 2.000000+7 1.000000+0                       125 3102     \n";
}